

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Plan::NodeFinished(Plan *this,Node *node,string *err)

{
  bool bVar1;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar2;
  reference __x;
  _Self local_48;
  _Self local_40;
  iterator want_e;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_30;
  const_iterator oe;
  string *err_local;
  Node *node_local;
  Plan *this_local;
  
  oe._M_current = (Edge **)err;
  bVar1 = Node::dyndep_pending(node);
  if (bVar1) {
    if (this->builder_ == (Builder *)0x0) {
      __assert_fail("builder_ && \"dyndep requires Plan to have a Builder\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                    ,0x1bb,"bool Plan::NodeFinished(Node *, string *)");
    }
    this_local._7_1_ = Builder::LoadDyndeps(this->builder_,node,(string *)oe._M_current);
  }
  else {
    pvVar2 = Node::out_edges(node);
    local_30._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar2);
    while( true ) {
      pvVar2 = Node::out_edges(node);
      want_e._M_node = (_Base_ptr)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar2);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)&want_e);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
            operator*(&local_30);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::find(&this->want_,__x);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
           ::end(&this->want_);
      bVar1 = std::operator==(&local_40,&local_48);
      if ((!bVar1) &&
         (bVar1 = EdgeMaybeReady(this,(iterator)local_40._M_node,(string *)oe._M_current), !bVar1))
      {
        return false;
      }
      __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_30);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Plan::NodeFinished(Node* node, string* err) {
  // If this node provides dyndep info, load it now.
  if (node->dyndep_pending()) {
    assert(builder_ && "dyndep requires Plan to have a Builder");
    // Load the now-clean dyndep file.  This will also update the
    // build plan and schedule any new work that is ready.
    return builder_->LoadDyndeps(node, err);
  }

  // See if we we want any edges from this node.
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end())
      continue;

    // See if the edge is now ready.
    if (!EdgeMaybeReady(want_e, err))
      return false;
  }
  return true;
}